

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

void D_RemoveNextCharEvent(void)

{
  long lVar1;
  bool bVar2;
  event_t *ev;
  int evnum;
  
  bVar2 = false;
  if (events[eventtail].type == '\x04') {
    bVar2 = events[eventtail].subtype == '\x01';
  }
  if (bVar2) {
    ev._4_4_ = eventtail;
    while( true ) {
      if (ev._4_4_ == eventhead) {
        return;
      }
      lVar1 = (long)(int)ev._4_4_;
      if (events[lVar1].type != '\x04') break;
      if ((events[lVar1].subtype != '\x01') && (events[lVar1].subtype != '\x04')) {
        return;
      }
      events[lVar1].type = '\0';
      if (events[lVar1].subtype == '\x04') {
        return;
      }
      ev._4_4_ = ev._4_4_ + 1 & 0x7f;
    }
    return;
  }
  __assert_fail("events[eventtail].type == EV_GUI_Event && events[eventtail].subtype == EV_GUI_KeyDown"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_main.cpp"
                ,0x163,"void D_RemoveNextCharEvent()");
}

Assistant:

void D_RemoveNextCharEvent()
{
	assert(events[eventtail].type == EV_GUI_Event && events[eventtail].subtype == EV_GUI_KeyDown);
	for (int evnum = eventtail; evnum != eventhead; evnum = (evnum+1) & (MAXEVENTS-1))
	{
		event_t *ev = &events[evnum];
		if (ev->type != EV_GUI_Event)
			break;
		if (ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_Char)
		{
			ev->type = EV_None;
			if (ev->subtype == EV_GUI_Char)
				break;
		}
		else
		{
			break;
		}
	}
}